

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access_block64(int g_a,int64_t idx,void *ptr,int64_t *ld)

{
  long in_RCX;
  undefined8 in_RSI;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer iblock;
  Integer ndim;
  Integer a;
  Integer in_stack_00000170;
  Integer *in_stack_00000248;
  void *in_stack_00000250;
  Integer in_stack_00000258;
  Integer in_stack_00000260;
  int local_7c;
  undefined8 local_78 [8];
  undefined8 local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined8 local_10;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000170);
  local_38 = local_10;
  pnga_access_block_ptr(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
  for (local_7c = 0; (long)local_7c < local_30 + -1; local_7c = local_7c + 1) {
    *(undefined8 *)(local_20 + ((local_30 - local_7c) + -2) * 8) = local_78[local_7c];
  }
  return;
}

Assistant:

void NGA_Access_block64(int g_a, int64_t idx, void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer iblock = (Integer)idx;
     Integer _ga_work[MAXDIM];
     wnga_access_block_ptr(a,iblock,ptr,_ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}